

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostDetailsProvider.cpp
# Opt level: O2

HostDetails * __thiscall
FIX::HostDetailsProvider::getHost
          (HostDetails *__return_storage_ptr__,HostDetailsProvider *this,SessionID *s,Dictionary *d)

{
  bool bVar1;
  __type_conflict1 _Var2;
  int iVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  long lVar6;
  HostDetails *this_00;
  HostDetails *this_01;
  pair<std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>,_bool>
  pVar7;
  allocator<char> local_99;
  string local_98;
  HostDetails *local_78;
  string local_70;
  string hostSelectionPolicy;
  
  hostSelectionPolicy._M_dataplus._M_p = (pointer)&hostSelectionPolicy.field_2;
  hostSelectionPolicy._M_string_length = 0;
  hostSelectionPolicy.field_2._M_local_buf[0] = '\0';
  local_78 = __return_storage_ptr__;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"HostSelectionPolicy",(allocator<char> *)&local_70);
  bVar1 = Dictionary::has(d,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"HostSelectionPolicy",&local_99);
    Dictionary::getString(&local_98,d,&local_70,false);
    std::__cxx11::string::operator=((string *)&hostSelectionPolicy,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_70);
  }
  iVar4 = std::
          _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::HostDetailsProvider::LastConnectionAttempt>_>_>
          ::find(&(this->m_sessionToLastConnectionAttempt)._M_t,s);
  p_Var5 = (_Base_ptr)std::function<long_()>::operator()(&this->getTime);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->m_sessionToLastConnectionAttempt)._M_t._M_impl.super__Rb_tree_header) {
    local_98._M_dataplus._M_p._0_4_ = 0;
    local_98._M_string_length = (size_type)p_Var5;
    pVar7 = std::
            _Rb_tree<FIX::SessionID,std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>,std::_Select1st<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>,std::less<FIX::SessionID>,std::allocator<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>>
            ::
            _M_emplace_unique<FIX::SessionID_const&,FIX::HostDetailsProvider::LastConnectionAttempt>
                      ((_Rb_tree<FIX::SessionID,std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>,std::_Select1st<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>,std::less<FIX::SessionID>,std::allocator<std::pair<FIX::SessionID_const,FIX::HostDetailsProvider::LastConnectionAttempt>>>
                        *)&this->m_sessionToLastConnectionAttempt,s,
                       (LastConnectionAttempt *)&local_98);
    iVar4._M_node = (_Base_ptr)pVar7.first._M_node;
    this_01 = local_78;
    goto LAB_0018a354;
  }
  _Var2 = std::operator==(&hostSelectionPolicy,&HOST_SELECTION_POLICY_PRIORITY_abi_cxx11_);
  this_01 = local_78;
  if (_Var2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"HostSelectionPolicyPriorityStartOverInterval",
               (allocator<char> *)&local_70);
    bVar1 = Dictionary::has(d,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"HostSelectionPolicyPriorityStartOverInterval",
                 (allocator<char> *)&local_70);
      iVar3 = Dictionary::getInt(d,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      lVar6 = (long)iVar3;
    }
    else {
      lVar6 = 0x78;
    }
    if ((long)p_Var5 - (long)iVar4._M_node[0xb]._M_right < lVar6) goto LAB_0018a33c;
    *(undefined4 *)&iVar4._M_node[0xb]._M_left = 0;
  }
  else {
LAB_0018a33c:
    *(int *)&iVar4._M_node[0xb]._M_left = *(int *)&iVar4._M_node[0xb]._M_left + 1;
  }
  iVar4._M_node[0xb]._M_right = p_Var5;
LAB_0018a354:
  this_00 = this_01;
  HostDetails::HostDetails(this_01);
  bVar1 = populateHostDetails((HostDetailsProvider *)this_00,*(int *)&iVar4._M_node[0xb]._M_left,d,
                              this_01);
  if (!bVar1) {
    populateHostDetails((HostDetailsProvider *)this_00,0,d,this_01);
    *(undefined4 *)&iVar4._M_node[0xb]._M_left = 0;
  }
  std::__cxx11::string::~string((string *)&hostSelectionPolicy);
  return this_01;
}

Assistant:

FIX::HostDetails FIX::HostDetailsProvider::getHost(const SessionID &s, const Dictionary &d) {
  std::string hostSelectionPolicy;
  if (d.has(HOST_SELECTION_POLICY)) {
    hostSelectionPolicy = d.getString(HOST_SELECTION_POLICY);
  }

  auto sessionIt = m_sessionToLastConnectionAttempt.find(s);

  time_t now = getTime();

  if (sessionIt == m_sessionToLastConnectionAttempt.end()) {
    auto result = m_sessionToLastConnectionAttempt.emplace(s, LastConnectionAttempt{0, now});
    sessionIt = result.first;
  } else {
    if (hostSelectionPolicy == HOST_SELECTION_POLICY_PRIORITY) {
      int startOverInterval = 120;
      if (d.has(HOST_SELECTION_POLICY_PRIORITY_START_OVER_INTERVAL)) {
        startOverInterval = d.getInt(HOST_SELECTION_POLICY_PRIORITY_START_OVER_INTERVAL);
      }

      if ((now - sessionIt->second.time >= startOverInterval)) {
        sessionIt->second.hostNumber = 0;
        sessionIt->second.time = now;
      } else {
        ++sessionIt->second.hostNumber;
        sessionIt->second.time = now;
      }
    } else {
      ++sessionIt->second.hostNumber;
      sessionIt->second.time = now;
    }
  }

  HostDetails details;
  bool isDefinedInSettings = populateHostDetails(sessionIt->second.hostNumber, d, details);

  if (!isDefinedInSettings) {
    populateHostDetails(0, d, details);
    sessionIt->second.hostNumber = 0;
  }

  return details;
}